

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O3

void __thiscall helics::apps::App::loadTextFile(App *this,string *textFile)

{
  AppTextParser aparser;
  vector<int,_std::allocator<int>_> local_2a0;
  vector<char,_std::allocator<char>_> local_288;
  AppTextParser local_268;
  
  AppTextParser::AppTextParser(&local_268,textFile);
  local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_288.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  AppTextParser::preParseFile(&local_2a0,&local_268,&local_288);
  if (local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  loadConfigOptions(this,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.mFileName._M_dataplus._M_p != &local_268.mFileName.field_2) {
    operator_delete(local_268.mFileName._M_dataplus._M_p,
                    local_268.mFileName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.configStr._M_dataplus._M_p != &local_268.configStr.field_2) {
    operator_delete(local_268.configStr._M_dataplus._M_p,
                    local_268.configStr.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(&local_268.filePtr);
  return;
}

Assistant:

void App::loadTextFile(const std::string& textFile)
{
    AppTextParser aparser(textFile);
    aparser.preParseFile({});
    loadConfigOptions(aparser);
}